

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O0

void * operator_new__(size_t count,align_val_t al)

{
  IibAllocatorBase *this;
  long lVar1;
  unsigned_long *puVar2;
  bad_alloc *this_00;
  long *in_FS_OFFSET;
  unsigned_long *in_stack_fffffffffffffea0;
  void *local_138;
  void *local_130;
  void **local_128;
  void **local_120;
  unsigned_long local_118 [3];
  align_val_t local_100;
  void **local_f8;
  align_val_t local_f0;
  void **local_e8;
  void *local_e0;
  void *ret;
  align_val_t al_local;
  size_t count_local;
  IibAllocatorBase *local_c0;
  void *local_b8;
  void *ptr;
  unsigned_long local_a8;
  void *local_a0;
  anon_class_8_1_ba1d7401 local_98;
  void *local_90;
  void *ret_1;
  IibAllocatorBase *local_80;
  void *local_78;
  void *ret_2;
  byte local_61;
  align_val_t aStack_60;
  uint8_t szidx;
  IibAllocatorBase *local_58;
  void *local_50;
  byte local_41;
  long lStack_40;
  uint8_t addition;
  uint64_t ix;
  byte local_29;
  void *local_28;
  void *ret_3;
  IibAllocatorBase *pIStack_18;
  uint8_t szidx_1;
  void *local_10;
  
  ret = (void *)al;
  al_local = count;
  if (*(long *)(*in_FS_OFFSET + -0x20) == 0) {
    local_f8 = &ret;
    local_118[2] = 0x20;
    local_118[1] = 0x10;
    local_100 = al;
    puVar2 = std::max<unsigned_long>(local_118 + 2,local_118 + 1);
    local_118[0] = 8;
    puVar2 = std::max<unsigned_long>(puVar2,local_118);
    void_nodecpp::assert::nodecpp_assert<2ul,(nodecpp::assert::
    AssertLevel)2,operator_new[](unsigned_long,std::align_val_t)::operator_new__
              ((align_val_t_ *)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,(char *)0x83,(int)&local_f8,
               (anon_class_8_1_3fcf64e9 *)"(size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW",
               "{} vs. {}",(char *)&local_100,puVar2,in_stack_fffffffffffffea0);
    ptr = (void *)al_local;
    local_e0 = malloc(al_local);
    local_b8 = local_e0;
    if (local_e0 == (void *)0x0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else {
    local_e8 = &ret;
    local_f0 = al;
    void_nodecpp::assert::nodecpp_assert<2ul,(nodecpp::assert::
    AssertLevel)2,operator_new[](unsigned_long,std::align_val_t)::operator_new__
              ((align_val_t_ *)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,(char *)0x7e,(int)&local_e8,
               (anon_class_8_1_3fcf64e9 *)
               "(size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment","{} vs. {}",
               (char *)&local_f0,&nodecpp::iibmalloc::IibAllocatorBase::maximalSupportedAlignment,
               in_stack_fffffffffffffea0);
    this = *(IibAllocatorBase **)(*in_FS_OFFSET + -0x20);
    count_local = al_local;
    ret_1 = (void *)al_local;
    local_90 = (void *)0x0;
    local_c0 = this;
    local_80 = this;
    if (al_local < 0x31) {
      ret_3._7_1_ = 6;
      pIStack_18 = this;
      if (this->buckets[6] == (void *)0x0) {
        local_10 = nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket
                             (this,0x31,'\x06');
      }
      else {
        local_28 = this->buckets[6];
        this->buckets[6] = *this->buckets[6];
        local_10 = local_28;
      }
      local_90 = local_10;
    }
    else {
      aStack_60 = al_local;
      local_58 = this;
      if (al_local < 0x2001) {
        ix = al_local;
        if (al_local < 9) {
          local_29 = 0;
        }
        else {
          ix = al_local - 1;
          lVar1 = 0x3f;
          if (ix != 0) {
            for (; ix >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          lVar1 = -(long)(int)((uint)lVar1 ^ 0x3f);
          local_41 = (byte)(ix >> ((char)lVar1 + 0x3eU & 0x3f)) & 1;
          lStack_40 = (lVar1 + 0x3d) * 2 + (ulong)local_41 + -1;
          local_29 = (byte)lStack_40;
        }
        local_61 = local_29;
        ret_2 = &local_61;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::IibAllocatorBase::allocate(unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x459,(anon_class_8_1_a8a78a16 *)&ret_2,"szidx < BucketCount");
        if (this->buckets[local_61] == (void *)0x0) {
          local_50 = nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket
                               (this,aStack_60,local_61);
        }
        else {
          local_78 = this->buckets[local_61];
          this->buckets[local_61] = *this->buckets[local_61];
          local_50 = local_78;
        }
      }
      else {
        local_50 = nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseTooLargeForBucket
                             (this,al_local);
      }
      local_90 = local_50;
    }
    local_98.ret = &local_90;
    local_a0 = local_90;
    local_a8 = 0x20;
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,nodecpp::iibmalloc::IibAllocatorBase::allocateAligned<32ul>(unsigned_long)::_lambda()_1_,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x4a4,&local_98,"((uintptr_t)ret & (alignment - 1)) == 0",
               "ret = 0x{:x}, alignment = {}",(unsigned_long *)&local_a0,&local_a8);
    local_e0 = local_90;
  }
  local_128 = &local_e0;
  local_120 = &ret;
  local_130 = local_e0;
  local_138 = ret;
  void_nodecpp::assert::nodecpp_assert<2ul,(nodecpp::assert::
  AssertLevel)2,operator_new[](unsigned_long,std::align_val_t)::operator_new__
            ((align_val_t_ *)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
             ,(char *)0x86,(int)&local_128,
             (anon_class_16_2_c96413e1 *)"( (size_t)ret & ((size_t)al - 1)) == 0",
             "ret = 0x{:x}, al = {}",(char *)&local_130,(unsigned_long *)&local_138,
             in_stack_fffffffffffffea0);
  return local_e0;
}

Assistant:

void* operator new[](std::size_t count, std::align_val_t al)
{
	void* ret;
	if ( g_CurrentAllocManager )
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment, "{} vs. {}", (size_t)al, ThreadLocalAllocatorT::maximalSupportedAlignment );
		ret = g_CurrentAllocManager->allocateAligned<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	else
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW, "{} vs. {}", (size_t)al, NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW );
		ret = nodecpp::StdRawAllocator::allocate<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, ( (size_t)ret & ((size_t)al - 1)) == 0, "ret = 0x{:x}, al = {}", (size_t)ret, (size_t)al );
	return ret; 
}